

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::glTFImporter::CanRead(glTFImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  IOSystem *pFile_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  bool local_821;
  string local_800 [8];
  string version;
  Asset asset;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool param_3_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  glTFImporter *this_local;
  
  extension._7_1_ = param_3;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  BaseImporter::GetExtension(&local_58,pFile);
  local_38 = &local_58;
  bVar1 = std::operator!=(&local_58,"gltf");
  if ((bVar1) && (bVar1 = std::operator!=(local_38,"glb"), bVar1)) {
    this_local._7_1_ = 0;
    asset.scene.index = 1;
  }
  else {
    if (pIStack_28 != (IOSystem *)0x0) {
      glTF::Asset::Asset((Asset *)((long)&version.field_2 + 8),pIStack_28);
      pFile_00 = pIOHandler_local;
      bVar1 = std::operator==(local_38,"glb");
      glTF::Asset::Load((Asset *)((long)&version.field_2 + 8),(string *)pFile_00,bVar1);
      std::__cxx11::string::string
                (local_800,(string *)(asset.asset.profile.version.field_2._M_local_buf + 8));
      uVar2 = std::__cxx11::string::empty();
      local_821 = false;
      if ((uVar2 & 1) == 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_800);
        local_821 = *pcVar3 == '1';
      }
      this_local._7_1_ = local_821;
      asset.scene.index = 1;
      std::__cxx11::string::~string(local_800);
      glTF::Asset::~Asset((Asset *)((long)&version.field_2 + 8));
      if (asset.scene.index != 0) goto LAB_00acc7a5;
    }
    this_local._7_1_ = 0;
    asset.scene.index = 1;
  }
LAB_00acc7a5:
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool glTFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const {
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb") {
        return false;
    }

    if (pIOHandler) {
        glTF::Asset asset(pIOHandler);
        try {
            asset.Load(pFile, extension == "glb");
            std::string version = asset.asset.version;
            return !version.empty() && version[0] == '1';
        } catch (...) {
            return false;
        }
    }

    return false;
}